

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::TableViewCell::minimumSizeHint(TableViewCell *this)

{
  int iVar1;
  int iVar2;
  TableViewCellPrivate *pTVar3;
  int *piVar4;
  QMargins local_c0;
  QMargins local_b0;
  QMargins local_a0;
  QMargins local_90;
  QSize local_80;
  int local_78;
  QSize QStack_74;
  int accessoryHeight;
  int local_6c;
  QSize QStack_68;
  int accessoryWidth;
  QSize local_60;
  int local_58;
  QSize QStack_54;
  int textHeight;
  int local_4c;
  QSize local_48;
  int local_40;
  int local_3c;
  int local_38;
  int textWidth;
  int local_2c;
  int local_28;
  QSize QStack_24;
  int height;
  int local_1c;
  TableViewCell *pTStack_18;
  int width;
  TableViewCell *this_local;
  
  pTStack_18 = this;
  pTVar3 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  QStack_24 = (QSize)(**(code **)(*(long *)pTVar3->imageLabel + 0x70))();
  local_1c = QSize::width(&stack0xffffffffffffffdc);
  pTVar3 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  _textWidth = (QSize)(**(code **)(*(long *)pTVar3->imageLabel + 0x70))();
  local_2c = QSize::height((QSize *)&textWidth);
  local_38 = FingerGeometry::height();
  piVar4 = qMax<int>(&local_2c,&local_38);
  local_28 = *piVar4;
  pTVar3 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  local_48 = (QSize)(**(code **)(*(long *)pTVar3->textLabel + 0x70))();
  local_40 = QSize::width(&local_48);
  pTVar3 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  QStack_54 = (QSize)(**(code **)(*(long *)pTVar3->detailedTextLabel + 0x70))();
  local_4c = QSize::width(&stack0xffffffffffffffac);
  piVar4 = qMax<int>(&local_40,&local_4c);
  local_3c = *piVar4;
  pTVar3 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  local_60 = (QSize)(**(code **)(*(long *)pTVar3->textLabel + 0x70))();
  iVar1 = QSize::height(&local_60);
  pTVar3 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  QStack_68 = (QSize)(**(code **)(*(long *)pTVar3->detailedTextLabel + 0x70))();
  local_58 = QSize::height(&stack0xffffffffffffff98);
  local_58 = iVar1 + local_58;
  local_1c = local_3c + local_1c;
  piVar4 = qMax<int>(&local_28,&local_58);
  local_28 = *piVar4;
  pTVar3 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  QStack_74 = (QSize)(**(code **)(*(long *)pTVar3->accessoryWidget + 0x70))();
  local_6c = QSize::width(&stack0xffffffffffffff8c);
  pTVar3 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  local_80 = (QSize)(**(code **)(*(long *)pTVar3->accessoryWidget + 0x70))();
  local_78 = QSize::height(&local_80);
  local_1c = local_6c + local_1c;
  piVar4 = qMax<int>(&local_28,&local_78);
  local_28 = *piVar4;
  QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
  ::operator->(&this->d);
  local_90 = (QMargins)QLayout::contentsMargins();
  iVar1 = QMargins::left(&local_90);
  QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
  ::operator->(&this->d);
  local_a0 = (QMargins)QLayout::contentsMargins();
  iVar2 = QMargins::right(&local_a0);
  local_1c = iVar1 + iVar2 + local_1c;
  QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
  ::operator->(&this->d);
  local_b0 = (QMargins)QLayout::contentsMargins();
  iVar1 = QMargins::bottom(&local_b0);
  QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
  ::operator->(&this->d);
  local_c0 = (QMargins)QLayout::contentsMargins();
  iVar2 = QMargins::top(&local_c0);
  local_28 = iVar1 + iVar2 + local_28;
  QSize::QSize((QSize *)&this_local,local_1c,local_28);
  return (QSize)this_local;
}

Assistant:

QSize
TableViewCell::minimumSizeHint() const
{
	int width = d->imageLabel->sizeHint().width();
	int height = qMax( d->imageLabel->sizeHint().height(),
		FingerGeometry::height() );

	const int textWidth = qMax( d->textLabel->sizeHint().width(),
		d->detailedTextLabel->sizeHint().width() );
	const int textHeight = d->textLabel->sizeHint().height() +
		d->detailedTextLabel->sizeHint().height();

	width += textWidth;
	height = qMax( height, textHeight );

	const int accessoryWidth = d->accessoryWidget->sizeHint().width();
	const int accessoryHeight = d->accessoryWidget->sizeHint().height();

	width += accessoryWidth;
	height = qMax( height, accessoryHeight );

	width += d->layout->contentsMargins().left() +
		d->layout->contentsMargins().right();
	height += d->layout->contentsMargins().bottom() +
		d->layout->contentsMargins().top();

	return QSize( width, height );
}